

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O1

Own<const_kj::ReadableFile,_std::nullptr_t> __thiscall
kj::ReadableDirectory::openFile(ReadableDirectory *this,PathPtr path)

{
  Clock *clock;
  ReadableFile *extraout_RDX;
  ReadableFile *pRVar1;
  Own<kj::File,_std::nullptr_t> OVar2;
  Own<const_kj::ReadableFile,_std::nullptr_t> OVar3;
  Fault f;
  _func_int **local_28;
  PathPtr path_local;
  
  path_local.parts.ptr = (String *)path.parts.size_;
  (**(code **)(((path.parts.ptr)->content).ptr + 0x50))(&f);
  if (local_28 == (_func_int **)0x0) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[13],kj::PathPtr&>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
               ,0x22b,FAILED,(char *)0x0,"\"no such file\", path",(char (*) [13])"no such file",
               &path_local);
    kj::_::Debug::Fault::~Fault(&f);
    clock = nullClock();
    OVar2 = newInMemoryFile((kj *)&f,clock);
    pRVar1 = &(OVar2.ptr)->super_ReadableFile;
    (this->super_FsNode)._vptr_FsNode = (_func_int **)f.exception;
  }
  else {
    (this->super_FsNode)._vptr_FsNode = (_func_int **)f.exception;
    pRVar1 = extraout_RDX;
  }
  this[1].super_FsNode._vptr_FsNode = local_28;
  OVar3.ptr = pRVar1;
  OVar3.disposer = (Disposer *)this;
  return OVar3;
}

Assistant:

Own<const ReadableFile> ReadableDirectory::openFile(PathPtr path) const {
  KJ_IF_SOME(file, tryOpenFile(path)) {
    return kj::mv(file);
  } else {
    KJ_FAIL_REQUIRE("no such file", path) { break; }